

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  Hsh_IntMan_t *p_00;
  Vec_Int_t *pVVar1;
  Vec_Wrd_t *pVVar2;
  int iData;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ushort *puVar7;
  Aig_Obj_t *pAVar8;
  ulong uVar9;
  Hsh_IntObj_t *pHVar10;
  int *piVar11;
  uint *__s2;
  word *pwVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  Vec_Wrd_t *pVVar16;
  uint uVar17;
  uint uVar18;
  undefined4 *puVar19;
  long lVar20;
  uint *puVar21;
  ulong uVar22;
  int *piVar23;
  int Lits [5];
  uint local_48 [6];
  
  uVar3 = Saig_ManBmcLiteral(p,pObj,iFrame);
  if (uVar3 == 0xffffffff) {
    if (iFrame < 0) {
      __assert_fail("iFrame >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x423,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
    uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar14 = uVar3 & 7;
    if (uVar14 == 3) {
      uVar3 = Saig_ManBmcCreateCnf_rec
                        (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iFrame);
      uVar3 = *(uint *)&pObj->pFanin0 & 1 ^ uVar3;
    }
    else if (uVar14 == 2) {
      iVar4 = Saig_ObjIsPi(p->pAig,pObj);
      if (iVar4 == 0) {
        pAVar8 = Saig_ObjLoToLi(p->pAig,pObj);
        uVar3 = Saig_ManBmcCreateCnf_rec(p,pAVar8,iFrame + -1);
      }
      else {
        iVar4 = p->nSatVars;
        p->nSatVars = iVar4 + 1;
        uVar3 = iVar4 * 2;
      }
    }
    else {
      if ((uVar3 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                      ,0x433,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
      }
      puVar7 = (ushort *)Saig_ManBmcMapping(p,pObj);
      for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
        iVar4 = -1;
        if (*(int *)(puVar7 + lVar20 * 2 + 2) != -1) {
          pAVar8 = Aig_ManObj(p->pAig,*(int *)(puVar7 + lVar20 * 2 + 2));
          iVar4 = Saig_ManBmcCreateCnf_rec(p,pAVar8,iFrame);
        }
        Lits[lVar20] = iVar4;
      }
      uVar3 = (uint)*puVar7;
      puVar21 = &Saig_ManBmcCof1_s_Truth;
      for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
        if (Lits[lVar20] == 1) {
          uVar3 = uVar3 & *puVar21;
          uVar14 = uVar3 >> ((byte)(1 << ((byte)lVar20 & 0x1f)) & 0x1f);
LAB_00479c59:
          uVar3 = uVar14 & 0xffff | uVar3;
          Lits[lVar20] = -1;
        }
        else if (Lits[lVar20] == 0) {
          uVar3 = uVar3 & ~*puVar21;
          uVar14 = uVar3 << ((byte)(1 << ((byte)lVar20 & 0x1f)) & 0x1f);
          goto LAB_00479c59;
        }
        puVar21 = puVar21 + 1;
      }
      puVar21 = &DAT_0081c8d4;
      puVar19 = &DAT_0081c8c8;
      for (uVar22 = 0; uVar22 != 4; uVar22 = uVar22 + 1) {
        uVar14 = 0xff;
        bVar13 = 8;
        if (uVar22 < 3) {
          bVar13 = (byte)*puVar19;
          uVar14 = *puVar21;
        }
        uVar14 = (uVar3 >> (bVar13 & 0x1f) ^ uVar3) & uVar14;
        if (Lits[uVar22] == -1) {
          if (uVar14 != 0) {
            __assert_fail("Saig_ManBmcCofEqual(uTruth, v)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                          ,0x3d0,"int Saig_ManBmcReduceTruth(int, int *)");
          }
        }
        else if (uVar14 == 0) {
          Lits[uVar22] = -1;
        }
        puVar21 = puVar21 + 1;
        puVar19 = puVar19 + 1;
      }
      if ((uVar3 == 0xffff) || (uVar3 == 0)) {
        uVar3 = (uint)(uVar3 == 0xffff);
      }
      else {
        uVar3 = Dar_CutSortVars(uVar3,Lits);
        if ((uVar3 == 0x5555) || (uVar3 == 0xaaaa)) {
          uVar3 = Abc_LitNotCond(Lits[0],(uint)(uVar3 == 0x5555));
          p->nBufNum = p->nBufNum + 1;
        }
        else {
          if ((uVar3 == 0xffff) || (uVar3 == 0)) {
            __assert_fail("uTruth != 0 && uTruth != 0xffff",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                          ,0x444,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
          }
          Lits[4] = ~uVar3 & 0xffff;
          if ((uVar3 & 1) == 0) {
            Lits[4] = uVar3;
          }
          iVar4 = p->vData->nSize;
          uVar22 = (long)iVar4 / 5;
          iData = (int)uVar22;
          if (iData * 5 != iVar4) {
            __assert_fail("iEntry * 5 == Vec_IntSize(p->vData)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                          ,0x450,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
          }
          for (lVar20 = 0; lVar20 != 5; lVar20 = lVar20 + 1) {
            Vec_IntPush(p->vData,Lits[lVar20]);
          }
          p_00 = p->vHash;
          pVVar1 = p_00->vTable;
          if (pVVar1->nSize < p_00->vObjs->nSize) {
            uVar14 = Abc_PrimeCudd(pVVar1->nSize * 2);
            Vec_IntGrow(pVVar1,uVar14);
            uVar9 = 0;
            uVar15 = (ulong)uVar14;
            if ((int)uVar14 < 1) {
              uVar15 = uVar9;
            }
            for (; uVar15 != uVar9; uVar9 = uVar9 + 1) {
              pVVar1->pArray[uVar9] = -1;
            }
            pVVar1->nSize = uVar14;
            for (iVar4 = 0; iVar4 < p_00->vObjs->nSize; iVar4 = iVar4 + 1) {
              pVVar1 = p_00->vTable;
              pHVar10 = Hsh_IntObj(p_00,iVar4);
              puVar21 = Hsh_IntData(p_00,pHVar10->iData);
              iVar5 = Hsh_IntManHash(puVar21,p_00->nSize,p_00->vTable->nSize);
              piVar11 = Vec_IntEntryP(pVVar1,iVar5);
              iVar5 = *piVar11;
              pHVar10 = Hsh_IntObj(p_00,iVar4);
              pHVar10->iNext = iVar5;
              *piVar11 = iVar4;
            }
          }
          puVar21 = Hsh_IntData(p_00,iData);
          pVVar1 = p_00->vTable;
          iVar4 = Hsh_IntManHash(puVar21,p_00->nSize,pVVar1->nSize);
          piVar11 = Vec_IntEntryP(pVVar1,iVar4);
          do {
            piVar23 = piVar11;
            pHVar10 = Hsh_IntObj(p_00,*piVar23);
            if (pHVar10 == (Hsh_IntObj_t *)0x0) {
              if (*piVar23 != -1) {
                __assert_fail("*pPlace == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecHsh.h"
                              ,0x138,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
              }
              goto LAB_00479f03;
            }
            __s2 = Hsh_IntData(p_00,pHVar10->iData);
            iVar4 = bcmp(puVar21,__s2,(long)p_00->nSize << 2);
            piVar11 = &pHVar10->iNext;
          } while (iVar4 != 0);
          if (*piVar23 == -1) {
LAB_00479f03:
            pVVar2 = p_00->vObjs;
            iVar4 = pVVar2->nSize;
            *piVar23 = iVar4;
            pVVar16 = pVVar2;
            if (iVar4 == pVVar2->nCap) {
              uVar14 = 0x10;
              if (0xf < iVar4) {
                uVar14 = iVar4 * 2;
              }
              if (iVar4 < (int)uVar14) {
                if (pVVar2->pArray == (word *)0x0) {
                  pwVar12 = (word *)malloc((ulong)uVar14 << 3);
                }
                else {
                  pwVar12 = (word *)realloc(pVVar2->pArray,(ulong)uVar14 << 3);
                }
                pVVar2->pArray = pwVar12;
                if (pwVar12 == (word *)0x0) {
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                                ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
                }
                pVVar2->nCap = uVar14;
                iVar4 = pVVar2->nSize;
                pVVar16 = p_00->vObjs;
              }
            }
            pVVar2->nSize = iVar4 + 1;
            pVVar2->pArray[iVar4] = uVar22 & 0xffffffff | 0xffffffff00000000;
            iVar4 = pVVar16->nSize + -1;
          }
          else {
            pHVar10 = Hsh_IntObj(p_00,*piVar23);
            iVar4 = (int)((ulong)((long)pHVar10 - (long)p_00->vObjs->pArray) >> 3);
          }
          if (iVar4 == iData) {
            iVar4 = p->nSatVars;
            p->nSatVars = iVar4 + 1;
            if (0xfffd < Lits[4] - 1U) {
              __assert_fail("uTruth > 0 && uTruth < 0xffff",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                            ,0x3e4,"void Saig_ManBmcAddClauses(Gia_ManBmc_t *, int, int *, int)");
            }
            uVar14 = iVar4 * 2;
            uVar6 = Lits[4];
            for (uVar18 = 0; uVar18 != 2; uVar18 = uVar18 + 1) {
              uVar17 = ~uVar6 & 0xffff;
              if (uVar18 == 0) {
                uVar17 = uVar6;
              }
              uVar6 = uVar17;
              for (lVar20 = 0; lVar20 < p->pSopSizes[uVar6]; lVar20 = lVar20 + 1) {
                local_48[0] = uVar18 ^ uVar14;
                uVar22 = 3;
                iVar4 = 1;
                iVar5 = (int)p->pSops[uVar6][lVar20];
                while( true ) {
                  if ((int)uVar22 < 0) break;
                  if (iVar5 % 3 == 1) {
                    if (Lits[uVar22] < 2) {
                      __assert_fail("Lits[b] > 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                                    ,0x3f9,
                                    "void Saig_ManBmcAddClauses(Gia_ManBmc_t *, int, int *, int)");
                    }
                    uVar17 = Lits[uVar22] ^ 1;
LAB_0047a058:
                    local_48[iVar4] = uVar17;
                    iVar4 = iVar4 + 1;
                  }
                  else if (iVar5 % 3 == 0) {
                    uVar17 = Lits[uVar22];
                    if ((int)uVar17 < 2) {
                      __assert_fail("Lits[b] > 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                                    ,0x3f4,
                                    "void Saig_ManBmcAddClauses(Gia_ManBmc_t *, int, int *, int)");
                    }
                    goto LAB_0047a058;
                  }
                  uVar22 = (ulong)((int)uVar22 - 1);
                  iVar5 = iVar5 / 3;
                }
                if (p->pSat2 == (solver_t *)0x0) {
                  if (p->pSat3 == (bmcg_sat_solver *)0x0) {
                    iVar4 = sat_solver_addclause(p->pSat,(lit *)local_48,(lit *)(local_48 + iVar4));
                    if (iVar4 == 0) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                                    ,0x40b,
                                    "void Saig_ManBmcAddClauses(Gia_ManBmc_t *, int, int *, int)");
                    }
                  }
                  else {
                    iVar4 = bmcg_sat_solver_addclause(p->pSat3,(int *)local_48,iVar4);
                    if (iVar4 == 0) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                                    ,0x406,
                                    "void Saig_ManBmcAddClauses(Gia_ManBmc_t *, int, int *, int)");
                    }
                  }
                }
                else {
                  iVar4 = satoko_add_clause(p->pSat2,(int *)local_48,iVar4);
                  if (iVar4 == 0) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                                  ,0x401,
                                  "void Saig_ManBmcAddClauses(Gia_ManBmc_t *, int, int *, int)");
                  }
                }
              }
            }
            if (iData != p->vId2Lit->nSize) {
              __assert_fail("iEntry == Vec_IntSize(p->vId2Lit)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                            ,0x458,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)")
              ;
            }
            Vec_IntPush(p->vId2Lit,uVar14);
            p->nHashMiss = p->nHashMiss + 1;
          }
          else {
            uVar14 = Vec_IntEntry(p->vId2Lit,iVar4);
            piVar11 = &p->vData->nSize;
            *piVar11 = *piVar11 + -5;
            p->nHashHit = p->nHashHit + 1;
          }
          uVar3 = Abc_LitNotCond(uVar14,uVar3 & 1);
        }
      }
    }
    Saig_ManBmcSetLiteral(p,pObj,iFrame,uVar3);
  }
  return uVar3;
}

Assistant:

int Saig_ManBmcCreateCnf_rec( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    extern unsigned Dar_CutSortVars( unsigned uTruth, int * pVars );
    int * pMapping, i, iLit, Lits[5], uTruth;
    iLit = Saig_ManBmcLiteral( p, pObj, iFrame );
    if ( iLit != ~0 )
        return iLit; 
    assert( iFrame >= 0 );
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( Saig_ObjIsPi(p->pAig, pObj) )
            iLit = toLit( p->nSatVars++ );
        else
            iLit = Saig_ManBmcCreateCnf_rec( p, Saig_ObjLoToLi(p->pAig, pObj), iFrame-1 );
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        iLit = Saig_ManBmcCreateCnf_rec( p, Aig_ObjFanin0(pObj), iFrame );
        if ( Aig_ObjFaninC0(pObj) )
            iLit = lit_neg(iLit);
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    assert( Aig_ObjIsNode(pObj) );
    pMapping = Saig_ManBmcMapping( p, pObj );
    for ( i = 0; i < 4; i++ )
        if ( pMapping[i+1] == -1 )
            Lits[i] = -1;
        else
            Lits[i] = Saig_ManBmcCreateCnf_rec( p, Aig_ManObj(p->pAig, pMapping[i+1]), iFrame );
    uTruth = 0xffff & (unsigned)pMapping[0];
    // propagate constants
    uTruth = Saig_ManBmcReduceTruth( uTruth, Lits );
    if ( uTruth == 0 || uTruth == 0xffff )
    {
        iLit = (uTruth == 0xffff);
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    // canonicize inputs
    uTruth = Dar_CutSortVars( uTruth, Lits );
    assert( uTruth != 0 && uTruth != 0xffff );
    if ( uTruth == 0xAAAA || uTruth == 0x5555 )
    {
        iLit = Abc_LitNotCond( Lits[0], uTruth == 0x5555 );
        p->nBufNum++;
    }
    else 
    {
        int iEntry, iRes;
        int fCompl = (uTruth & 1);
        Lits[4] = (uTruth & 1) ? 0xffff & ~uTruth : uTruth;
        iEntry = Vec_IntSize(p->vData) / 5;
        assert( iEntry * 5 == Vec_IntSize(p->vData) );
        for ( i = 0; i < 5; i++ )
            Vec_IntPush( p->vData, Lits[i] );
        iRes = Hsh_IntManAdd( p->vHash, iEntry );
        if ( iRes == iEntry )
        {
            iLit = toLit( p->nSatVars++ );
            Saig_ManBmcAddClauses( p, Lits[4], Lits, iLit );
            assert( iEntry == Vec_IntSize(p->vId2Lit) );
            Vec_IntPush( p->vId2Lit, iLit );
            p->nHashMiss++;
        }
        else
        {
            iLit = Vec_IntEntry( p->vId2Lit, iRes );
            Vec_IntShrink( p->vData, Vec_IntSize(p->vData) - 5 );
            p->nHashHit++;
        }
        iLit = Abc_LitNotCond( iLit, fCompl );
    }
    return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
}